

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int CmpClassPri(void *p,void *va,void *vb)

{
  int BPriority;
  int APriority;
  nodeclass **b;
  nodeclass **a;
  void *vb_local;
  void *va_local;
  void *p_local;
  
  if (*(short *)(*vb + 0x3e) < *(short *)(*va + 0x3e)) {
    p_local._4_4_ = -1;
  }
  else if (*(short *)(*va + 0x3e) < *(short *)(*vb + 0x3e)) {
    p_local._4_4_ = 1;
  }
  else {
    p_local._4_4_ = CmpClass((void *)0x0,va,vb);
  }
  return p_local._4_4_;
}

Assistant:

static NOINLINE int CmpClassPri(const void* UNUSED_PARAM(p), const void* va, const void* vb)
{
    const nodeclass* const* a = va;
    const nodeclass* const* b = vb;
    int APriority = (*a)->Priority;
    int BPriority = (*b)->Priority;
    if (APriority > BPriority) return -1;
    if (APriority < BPriority) return 1;
    return CmpClass(NULL,a,b);
}